

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  int dims;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  Mat *this_00;
  int in_stack_fffffffffffffea4;
  Mat *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  Mat *in_stack_fffffffffffffeb8;
  Mat local_130;
  Mat local_100 [4];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x1c);
  local_28 = *(int *)(in_RSI + 0x20);
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x18);
  Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  if (((*(int *)(in_RDI + 0x88) == 0) || (local_30 != 3)) || (local_2c != 1)) {
    if (((*(int *)(in_RDI + 0x84) == 0) || (local_30 < 2)) || (local_28 != 1)) {
      if (((*(int *)(in_RDI + 0x80) != 0) && (0 < local_30)) && (local_24 == 1)) {
        if ((*(int *)(in_RDI + 0x84) == 0) || (local_28 != 1)) {
          Mat::reshape(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0
                      );
          Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          Mat::~Mat((Mat *)0x141896);
        }
        else {
          in_stack_fffffffffffffe70 = &local_130;
          Mat::reshape(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
          Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          Mat::~Mat((Mat *)0x14182d);
        }
      }
    }
    else if ((*(int *)(in_RDI + 0x80) == 0) || (local_24 != 1)) {
      this_00 = local_100;
      Mat::reshape(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
      Mat::operator=(this_00,in_stack_fffffffffffffe70);
      Mat::~Mat((Mat *)0x14177e);
    }
    else {
      Mat::reshape(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      Mat::~Mat((Mat *)0x14170a);
    }
  }
  else if ((*(int *)(in_RDI + 0x84) == 0) || (local_28 != 1)) {
    Mat::reshape(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    Mat::~Mat((Mat *)0x141655);
  }
  else {
    Mat::reshape(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    Mat::~Mat((Mat *)0x1415e1);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffe70);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (squeeze_c && dims == 3 && channels == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(w);
        else
            top_blob = bottom_blob.reshape(w, h);
    }
    else if (squeeze_h && dims >= 2 && h == 1)
    {
        if (squeeze_w && w == 1)
            top_blob = bottom_blob.reshape(channels);
        else
            top_blob = bottom_blob.reshape(w, channels);
    }
    else if (squeeze_w && dims >= 1 && w == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(channels);
        else
            top_blob = bottom_blob.reshape(h, channels);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}